

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O2

void shuff_interp_encode(bit_io_t *bio,uint64_t *A,uint64_t n)

{
  long lVar1;
  long lVar2;
  long lVar3;
  stack *psVar4;
  uint uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  *A = 0;
  A[n] = 0x8000000;
  uVar7 = shuff_interp_encode::ss;
  uVar6 = SHUFF_ceil_log2(n);
  psVar4 = shuff_interp_encode::s;
  if (uVar7 < uVar6 + 1) {
    uVar7 = SHUFF_ceil_log2(n);
    shuff_interp_encode::s = (stack *)realloc(psVar4,uVar7 * 0x10 + 0x10);
    if (shuff_interp_encode::s == (stack *)0x0) {
      fwrite("Out of memory for stack\n",0x18,1,_stderr);
      exit(-1);
    }
    uVar7 = SHUFF_ceil_log2(n);
    shuff_interp_encode::ss = uVar7 + 1;
  }
  psVar4 = shuff_interp_encode::s;
  shuff_interp_encode::s->lo = 0;
  psVar4->hi = n;
  lVar10 = 1;
  while (lVar10 != 0) {
    lVar2 = shuff_interp_encode::s[lVar10 + -1].lo;
    lVar3 = shuff_interp_encode::s[lVar10 + -1].hi;
    uVar11 = (A[lVar3] - (lVar3 - lVar2)) - A[lVar2];
    uVar14 = lVar3 - lVar2 >> 1;
    lVar1 = uVar14 + lVar2;
    uVar5 = 0;
    lVar12 = uVar11 + 1;
    for (; uVar11 != 0; uVar11 = uVar11 >> 1) {
      uVar5 = uVar5 + 1;
    }
    lVar9 = lVar10 + -1;
    lVar8 = A[lVar1] - (A[lVar2] + uVar14);
    lVar12 = (1 << (uVar5 & 0x1f)) - lVar12;
    lVar13 = lVar12;
    if (lVar8 < lVar12) {
      lVar13 = 0;
    }
    SHUFF_OUTPUT_ULONG(bio,lVar13 + lVar8,(char)uVar5 - (lVar8 < lVar12));
    psVar4 = shuff_interp_encode::s;
    if ((1 < lVar3 - lVar1) && ((ulong)(lVar3 - lVar1) < A[lVar3] - A[lVar1])) {
      shuff_interp_encode::s[lVar9].lo = lVar1;
      psVar4[lVar9].hi = lVar3;
      lVar9 = lVar10;
    }
    psVar4 = shuff_interp_encode::s;
    lVar10 = lVar9;
    if ((1 < (long)uVar14) && (uVar14 < A[lVar1] - A[lVar2])) {
      lVar10 = lVar9 + 1;
      shuff_interp_encode::s[lVar9].lo = lVar2;
      psVar4[lVar9].hi = lVar1;
    }
  }
  return;
}

Assistant:

void shuff_interp_encode(bit_io_t* bio, uint64_t* A, uint64_t n)
{
    int64_t lo, hi, mid, range;
    static stack* s = NULL;
    static uint64_t ss = 0;
    uint64_t stack_pointer = 0;

    A[0] = 0;
    A[n] = SHUFF_MAX_SYMBOL;

    SHUFF_CHECK_STACK_SIZE(SHUFF_ceil_log2(n) + 1);

    SHUFF_PUSH(0, n);
    while (SHUFF_STACK_NOT_EMPTY) {
        SHUFF_POP(lo, hi);
        range = A[hi] - A[lo] - (hi - lo - 1);
        mid = lo + ((hi - lo) >> 1);
        SHUFF_BINARY_ENCODE(bio, A[mid] - (A[lo] + (mid - lo - 1)), range);
        if ((hi - mid > 1) && (A[hi] - A[mid] > (uint64_t)(hi - mid)))
            SHUFF_PUSH(mid, hi);
        if ((mid - lo > 1) && (A[mid] - A[lo] > (uint64_t)(mid - lo)))
            SHUFF_PUSH(lo, mid);
    }
}